

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O1

RealType __thiscall OpenMD::Thermo::getTranslationalKinetic(Thermo *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  Snapshot *this_00;
  long lVar4;
  Molecule *pMVar5;
  pointer ppSVar6;
  StuntDouble *pSVar7;
  StuntDouble *pSVar8;
  long lVar9;
  double dVar10;
  RealType RVar11;
  MoleculeIterator miter;
  MoleculeIterator local_20;
  
  this_00 = this->info_->sman_->currentSnapshot_;
  if (this_00->hasTranslationalKineticEnergy == false) {
    local_20._M_node = (_Base_ptr)0x0;
    pMVar5 = SimInfo::beginMolecule(this->info_,&local_20);
    dVar10 = 0.0;
    if (pMVar5 != (Molecule *)0x0) {
      do {
        ppSVar6 = (pMVar5->integrableObjects_).
                  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (ppSVar6 ==
            (pMVar5->integrableObjects_).
            super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          pSVar7 = (StuntDouble *)0x0;
        }
        else {
          pSVar7 = *ppSVar6;
        }
        if (pSVar7 != (StuntDouble *)0x0) {
          do {
            ppSVar6 = ppSVar6 + 1;
            if (ppSVar6 ==
                (pMVar5->integrableObjects_).
                super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
              pSVar8 = (StuntDouble *)0x0;
            }
            else {
              pSVar8 = *ppSVar6;
            }
            lVar9 = (long)pSVar7->localIndex_;
            lVar4 = *(long *)((long)&(pSVar7->snapshotMan_->currentSnapshot_->atomData).velocity.
                                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + pSVar7->storage_);
            dVar1 = *(double *)(lVar4 + lVar9 * 0x18);
            dVar2 = *(double *)(lVar4 + 8 + lVar9 * 0x18);
            dVar3 = *(double *)(lVar4 + 0x10 + lVar9 * 0x18);
            dVar10 = dVar10 + (dVar3 * dVar3 + dVar1 * dVar1 + dVar2 * dVar2) * pSVar7->mass_;
            pSVar7 = pSVar8;
          } while (pSVar8 != (StuntDouble *)0x0);
        }
        pMVar5 = SimInfo::nextMolecule(this->info_,&local_20);
      } while (pMVar5 != (Molecule *)0x0);
      dVar10 = dVar10 * 0.5;
    }
    Snapshot::setTranslationalKineticEnergy(this_00,dVar10 / 0.0004184);
  }
  RVar11 = Snapshot::getTranslationalKineticEnergy(this_00);
  return RVar11;
}

Assistant:

RealType Thermo::getTranslationalKinetic() {
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    if (!snap->hasTranslationalKineticEnergy) {
      SimInfo::MoleculeIterator miter;
      vector<StuntDouble*>::iterator iiter;
      Molecule* mol;
      StuntDouble* sd;
      Vector3d vel;
      RealType mass;
      RealType kinetic(0.0);

      for (mol = info_->beginMolecule(miter); mol != NULL;
           mol = info_->nextMolecule(miter)) {
        for (sd = mol->beginIntegrableObject(iiter); sd != NULL;
             sd = mol->nextIntegrableObject(iiter)) {
          mass = sd->getMass();
          vel  = sd->getVel();

          kinetic +=
              mass * (vel[0] * vel[0] + vel[1] * vel[1] + vel[2] * vel[2]);
        }
      }

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, &kinetic, 1, MPI_REALTYPE, MPI_SUM,
                    MPI_COMM_WORLD);
#endif

      kinetic = kinetic * 0.5 / Constants::energyConvert;

      snap->setTranslationalKineticEnergy(kinetic);
    }
    return snap->getTranslationalKineticEnergy();
  }